

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O0

UBool __thiscall icu_63::UnicodeString::startsWith(UnicodeString *this,UnicodeString *text)

{
  int8_t iVar1;
  int32_t _length;
  int32_t srcLength;
  UnicodeString *text_local;
  UnicodeString *this_local;
  
  _length = length(text);
  srcLength = length(text);
  iVar1 = compare(this,0,_length,text,0,srcLength);
  return iVar1 == '\0';
}

Assistant:

inline UBool
UnicodeString::startsWith(const UnicodeString& text) const
{ return compare(0, text.length(), text, 0, text.length()) == 0; }